

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seqmap.c
# Opt level: O2

void seqmap_free(seqmap_t *map)

{
  seqmap_entry_t *__ptr;
  size_t sVar1;
  long lVar2;
  bool bVar3;
  
  if (map != (seqmap_t *)0x0) {
    sVar1 = map->len;
    lVar2 = sVar1 * 0x10 + -8;
    while( true ) {
      __ptr = map->ptr;
      bVar3 = sVar1 == 0;
      sVar1 = sVar1 - 1;
      if (bVar3) break;
      if ((*(byte *)((long)__ptr + lVar2 + -4) & 1) != 0) {
        free(*(void **)((long)&__ptr->key + lVar2));
      }
      lVar2 = lVar2 + -0x10;
    }
    free(__ptr);
    free(map);
    return;
  }
  return;
}

Assistant:

void
seqmap_free(
    seqmap_t *map)
{
    if (!map)
        return;
    seqmap_entry_t *ent;
    seqmap_for_each(map, ent)
        if (ent->flags & SEQMAP_FLAG_ALLOC)
            free(ent->value);
    free(map->ptr);
    free(map);
}